

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsCreators.cpp
# Opt level: O1

shared_ptr<chrono::ChBody> __thiscall
chrono::utils::CreateBoxContainer
          (utils *this,ChSystem *system,int id,shared_ptr<chrono::ChMaterialSurface> *mat,
          ChVector<double> *hdim,double hthick,ChVector<double> *pos,ChQuaternion<double> *rot,
          bool collide,bool y_up,bool overlap,bool closed)

{
  long lVar1;
  long *plVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  ChBody *pCVar4;
  element_type *peVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  ChVector<double> *pCVar15;
  int iVar16;
  int iVar17;
  undefined4 extraout_var;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var18;
  undefined1 auVar19 [16];
  undefined8 in_XMM0_Qb;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  shared_ptr<chrono::ChBody> sVar26;
  ChVector<double> local_250;
  ChVector<double> local_238;
  ChQuaternion<double> local_218;
  double local_1f8;
  undefined8 uStack_1f0;
  double local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1d0;
  shared_ptr<chrono::ChMaterialSurface> local_1c8;
  shared_ptr<chrono::ChMaterialSurface> local_1b8;
  shared_ptr<chrono::ChMaterialSurface> local_1a8;
  shared_ptr<chrono::ChMaterialSurface> local_198;
  shared_ptr<chrono::ChMaterialSurface> local_188;
  shared_ptr<chrono::ChMaterialSurface> local_178;
  shared_ptr<chrono::ChMaterialSurface> local_168;
  shared_ptr<chrono::ChMaterialSurface> local_158;
  shared_ptr<chrono::ChMaterialSurface> local_148;
  shared_ptr<chrono::ChMaterialSurface> local_138;
  shared_ptr<chrono::ChMaterialSurface> local_128;
  shared_ptr<chrono::ChMaterialSurface> local_118;
  utils *local_108;
  ChSystem *local_100;
  ChVector<double> *local_f8;
  shared_ptr<chrono::ChVisualMaterial> local_f0;
  shared_ptr<chrono::ChVisualMaterial> local_e0;
  shared_ptr<chrono::ChVisualMaterial> local_d0;
  shared_ptr<chrono::ChVisualMaterial> local_c0;
  shared_ptr<chrono::ChVisualMaterial> local_b0;
  shared_ptr<chrono::ChVisualMaterial> local_a0;
  shared_ptr<chrono::ChVisualMaterial> local_90;
  shared_ptr<chrono::ChVisualMaterial> local_80;
  shared_ptr<chrono::ChVisualMaterial> local_70;
  shared_ptr<chrono::ChVisualMaterial> local_60;
  shared_ptr<chrono::ChVisualMaterial> local_50;
  shared_ptr<chrono::ChVisualMaterial> local_40;
  
  local_1f8 = (double)CONCAT44(local_1f8._4_4_,(uint)overlap);
  local_1e8 = hthick;
  uStack_1e0 = in_XMM0_Qb;
  local_f8 = hdim;
  iVar16 = (*((mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->_vptr_ChMaterialSurface[3])();
  iVar17 = (*(system->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x2f])
                     (system);
  if (iVar16 != iVar17) {
    __assert_fail("mat->GetContactMethod() == system->GetContactMethod()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/utils/ChUtilsCreators.cpp"
                  ,0x26f,
                  "std::shared_ptr<ChBody> chrono::utils::CreateBoxContainer(ChSystem *, int, std::shared_ptr<ChMaterialSurface>, const ChVector<> &, double, const ChVector<> &, const ChQuaternion<> &, bool, bool, bool, bool)"
                 );
  }
  local_100 = system;
  iVar16 = (*(system->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x30])
                     (system);
  *(ChBody **)this = (ChBody *)CONCAT44(extraout_var,iVar16);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChBody*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),
             (ChBody *)CONCAT44(extraout_var,iVar16));
  lVar1 = *(long *)this;
  *(int *)(lVar1 + 0x28) = id;
  local_108 = this + 8;
  ChVariablesBodyOwnMass::SetBodyMass((ChVariablesBodyOwnMass *)(lVar1 + 0x260),1.0);
  pCVar15 = local_f8;
  lVar1 = *(long *)this;
  if ((ChVector<double> *)(lVar1 + 0x80) != pos) {
    *(double *)(lVar1 + 0x80) = pos->m_data[0];
    *(double *)(lVar1 + 0x88) = pos->m_data[1];
    *(double *)(lVar1 + 0x90) = pos->m_data[2];
  }
  ChFrame<double>::SetRot((ChFrame<double> *)(lVar1 + 0x78),rot);
  ChBody::SetCollide(*(ChBody **)this,collide);
  ChBody::SetBodyFixed(*(ChBody **)this,true);
  plVar2 = *(long **)(*(long *)this + 0x198);
  p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*(long *)this + 0x1a0);
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  (**(code **)(*plVar2 + 0x18))();
  local_1f8 = (double)((ulong)(SUB81(local_1f8,0) & 1) * (long)(local_1e8 + local_1e8));
  uStack_1f0 = 0;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  pCVar4 = *(ChBody **)this;
  peVar5 = (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (y_up) {
    local_118.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
    if (local_118.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_118.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_118.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_118.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_118.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_250.m_data[0] = local_1f8 + pCVar15->m_data[0];
    local_250.m_data[2] = local_1f8 + pCVar15->m_data[1];
    auVar11._8_8_ = uStack_1e0;
    auVar11._0_8_ = local_1e8;
    local_250.m_data[1] = local_1e8;
    auVar6._8_8_ = 0x8000000000000000;
    auVar6._0_8_ = 0x8000000000000000;
    auVar19 = vxorpd_avx512vl(auVar11,auVar6);
    local_238.m_data[0] = 0.0;
    local_238.m_data[1] = (double)vmovlpd_avx(auVar19);
    local_238.m_data[2] = 0.0;
    local_218.m_data[0] = 1.0;
    local_218.m_data[1] = 0.0;
    local_218.m_data[2] = 0.0;
    local_218.m_data[3] = 0.0;
    local_118.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar5;
    ChVisualMaterial::Default();
    AddBoxGeometry(pCVar4,&local_118,&local_250,&local_238,&local_218,true,&local_40);
    if (local_40.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_118.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_118.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    pCVar4 = *(ChBody **)this;
    local_128.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_128.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
    if (local_128.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_128.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_128.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_128.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_128.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_238.m_data[1] = pCVar15->m_data[2];
    local_250.m_data[1] = local_1f8 + local_238.m_data[1];
    local_250.m_data[2] = local_1f8 + pCVar15->m_data[1];
    local_250.m_data[0] = local_1e8;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = pCVar15->m_data[0];
    auVar7._8_8_ = 0x8000000000000000;
    auVar7._0_8_ = 0x8000000000000000;
    auVar19 = vxorpd_avx512vl(auVar25,auVar7);
    local_238.m_data[0] = auVar19._0_8_ - local_1e8;
    local_238.m_data[2] = 0.0;
    local_218.m_data[0] = 1.0;
    local_218.m_data[1] = 0.0;
    local_218.m_data[2] = 0.0;
    local_218.m_data[3] = 0.0;
    ChVisualMaterial::Default();
    AddBoxGeometry(pCVar4,&local_128,&local_250,&local_238,&local_218,true,&local_50);
    if (local_50.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_50.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_128.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_128.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    pCVar4 = *(ChBody **)this;
    local_138.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_138.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
    if (local_138.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_138.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_138.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_138.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_138.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_238.m_data[1] = pCVar15->m_data[2];
    local_250.m_data[1] = local_1f8 + local_238.m_data[1];
    local_250.m_data[2] = local_1f8 + pCVar15->m_data[1];
    local_250.m_data[0] = local_1e8;
    local_238.m_data[0] = local_1e8 + pCVar15->m_data[0];
    local_238.m_data[2] = 0.0;
    local_218.m_data[0] = 1.0;
    local_218.m_data[1] = 0.0;
    local_218.m_data[2] = 0.0;
    local_218.m_data[3] = 0.0;
    ChVisualMaterial::Default();
    AddBoxGeometry(pCVar4,&local_138,&local_250,&local_238,&local_218,true,&local_60);
    if (local_60.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_138.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_138.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    pCVar4 = *(ChBody **)this;
    local_148.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_148.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
    if (local_148.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_148.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_148.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_148.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_148.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_250.m_data[0] = local_1f8 + pCVar15->m_data[0];
    local_238.m_data[1] = pCVar15->m_data[2];
    local_250.m_data[1] = local_1f8 + local_238.m_data[1];
    local_250.m_data[2] = local_1e8;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = pCVar15->m_data[1];
    auVar8._8_8_ = 0x8000000000000000;
    auVar8._0_8_ = 0x8000000000000000;
    auVar19 = vxorpd_avx512vl(auVar21,auVar8);
    local_238.m_data[2] = auVar19._0_8_ - local_1e8;
    local_238.m_data[0] = 0.0;
    local_218.m_data[0] = 1.0;
    local_218.m_data[1] = 0.0;
    local_218.m_data[2] = 0.0;
    local_218.m_data[3] = 0.0;
    ChVisualMaterial::Default();
    AddBoxGeometry(pCVar4,&local_148,&local_250,&local_238,&local_218,true,&local_70);
    if (local_70.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_148.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_148.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    pCVar4 = *(ChBody **)this;
    local_158.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_158.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
    if (local_158.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_158.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_158.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_158.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_158.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_250.m_data[0] = local_1f8 + pCVar15->m_data[0];
    local_238.m_data[1] = pCVar15->m_data[2];
    local_250.m_data[1] = local_1f8 + local_238.m_data[1];
    local_250.m_data[2] = local_1e8;
    local_238.m_data[2] = local_1e8 + pCVar15->m_data[1];
    local_238.m_data[0] = 0.0;
    local_218.m_data[0] = 1.0;
    local_218.m_data[1] = 0.0;
    local_218.m_data[2] = 0.0;
    local_218.m_data[3] = 0.0;
    ChVisualMaterial::Default();
    AddBoxGeometry(pCVar4,&local_158,&local_250,&local_238,&local_218,true,&local_80);
    if (local_80.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_80.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_158.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_158.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (!closed) goto LAB_0093ff41;
    pCVar4 = *(ChBody **)this;
    local_168.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_168.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
    if (local_168.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_168.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_168.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_168.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_168.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_250.m_data[0] = local_1f8 + pCVar15->m_data[0];
    local_250.m_data[2] = local_1f8 + pCVar15->m_data[1];
    auVar13._8_8_ = uStack_1e0;
    auVar13._0_8_ = local_1e8;
    local_250.m_data[1] = local_1e8;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = pCVar15->m_data[2];
    auVar19 = vfmadd132sd_fma(auVar23,auVar13,ZEXT816(0x4000000000000000));
    local_238.m_data[0] = 0.0;
    local_238.m_data[1] = auVar19._0_8_;
    local_238.m_data[2] = 0.0;
    local_218.m_data[0] = 1.0;
    local_218.m_data[1] = 0.0;
    local_218.m_data[2] = 0.0;
    local_218.m_data[3] = 0.0;
    ChVisualMaterial::Default();
    AddBoxGeometry(pCVar4,&local_168,&local_250,&local_238,&local_218,true,&local_90);
    _Var18._M_pi = local_168.
                   super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
    if (local_90.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_90.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var18._M_pi = local_168.
                     super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
    }
  }
  else {
    local_178.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
    if (local_178.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_178.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_178.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_178.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_178.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_250.m_data[0] = local_1f8 + pCVar15->m_data[0];
    local_250.m_data[1] = local_1f8 + pCVar15->m_data[1];
    auVar12._8_8_ = uStack_1e0;
    auVar12._0_8_ = local_1e8;
    local_250.m_data[2] = local_1e8;
    auVar19._8_8_ = 0x8000000000000000;
    auVar19._0_8_ = 0x8000000000000000;
    auVar19 = vxorpd_avx512vl(auVar12,auVar19);
    local_238.m_data[0] = 0.0;
    local_238.m_data[1] = 0.0;
    local_238.m_data[2] = (double)vmovlpd_avx(auVar19);
    local_218.m_data[0] = 1.0;
    local_218.m_data[1] = 0.0;
    local_218.m_data[2] = 0.0;
    local_218.m_data[3] = 0.0;
    local_178.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar5;
    ChVisualMaterial::Default();
    AddBoxGeometry(pCVar4,&local_178,&local_250,&local_238,&local_218,true,&local_a0);
    if (local_a0.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a0.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_178.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_178.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    pCVar4 = *(ChBody **)this;
    local_188.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_188.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
    if (local_188.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_188.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_188.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_188.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_188.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_250.m_data[1] = local_1f8 + pCVar15->m_data[1];
    local_238.m_data[2] = pCVar15->m_data[2];
    local_250.m_data[2] = local_1f8 + local_238.m_data[2];
    local_250.m_data[0] = local_1e8;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = pCVar15->m_data[0];
    auVar9._8_8_ = 0x8000000000000000;
    auVar9._0_8_ = 0x8000000000000000;
    auVar19 = vxorpd_avx512vl(auVar20,auVar9);
    local_238.m_data[0] = auVar19._0_8_ - local_1e8;
    local_238.m_data[1] = 0.0;
    local_218.m_data[0] = 1.0;
    local_218.m_data[1] = 0.0;
    local_218.m_data[2] = 0.0;
    local_218.m_data[3] = 0.0;
    ChVisualMaterial::Default();
    AddBoxGeometry(pCVar4,&local_188,&local_250,&local_238,&local_218,true,&local_b0);
    if (local_b0.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b0.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_188.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_188.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    pCVar4 = *(ChBody **)this;
    local_198.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_198.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
    if (local_198.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_198.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_198.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_198.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_198.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_250.m_data[1] = local_1f8 + pCVar15->m_data[1];
    local_238.m_data[2] = pCVar15->m_data[2];
    local_250.m_data[2] = local_1f8 + local_238.m_data[2];
    local_250.m_data[0] = local_1e8;
    local_238.m_data[0] = local_1e8 + pCVar15->m_data[0];
    local_238.m_data[1] = 0.0;
    local_218.m_data[0] = 1.0;
    local_218.m_data[1] = 0.0;
    local_218.m_data[2] = 0.0;
    local_218.m_data[3] = 0.0;
    ChVisualMaterial::Default();
    AddBoxGeometry(pCVar4,&local_198,&local_250,&local_238,&local_218,true,&local_c0);
    if (local_c0.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c0.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_198.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_198.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    pCVar4 = *(ChBody **)this;
    local_1a8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_1a8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
    if (local_1a8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_1a8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_1a8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_1a8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_1a8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_250.m_data[0] = local_1f8 + pCVar15->m_data[0];
    local_238.m_data[2] = pCVar15->m_data[2];
    local_250.m_data[2] = local_1f8 + local_238.m_data[2];
    local_250.m_data[1] = local_1e8;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = pCVar15->m_data[1];
    auVar10._8_8_ = 0x8000000000000000;
    auVar10._0_8_ = 0x8000000000000000;
    auVar19 = vxorpd_avx512vl(auVar22,auVar10);
    local_238.m_data[1] = auVar19._0_8_ - local_1e8;
    local_238.m_data[0] = 0.0;
    local_218.m_data[0] = 1.0;
    local_218.m_data[1] = 0.0;
    local_218.m_data[2] = 0.0;
    local_218.m_data[3] = 0.0;
    ChVisualMaterial::Default();
    AddBoxGeometry(pCVar4,&local_1a8,&local_250,&local_238,&local_218,true,&local_d0);
    if (local_d0.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d0.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_1a8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1a8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    pCVar4 = *(ChBody **)this;
    local_1b8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_1b8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
    if (local_1b8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_1b8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_1b8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_1b8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_1b8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_250.m_data[0] = local_1f8 + pCVar15->m_data[0];
    local_238.m_data[2] = pCVar15->m_data[2];
    local_250.m_data[2] = local_1f8 + local_238.m_data[2];
    local_250.m_data[1] = local_1e8;
    local_238.m_data[1] = local_1e8 + pCVar15->m_data[1];
    local_238.m_data[0] = 0.0;
    local_218.m_data[0] = 1.0;
    local_218.m_data[1] = 0.0;
    local_218.m_data[2] = 0.0;
    local_218.m_data[3] = 0.0;
    ChVisualMaterial::Default();
    AddBoxGeometry(pCVar4,&local_1b8,&local_250,&local_238,&local_218,true,&local_e0);
    if (local_e0.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e0.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_1b8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1b8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (!closed) goto LAB_0093ff41;
    pCVar4 = *(ChBody **)this;
    local_1c8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_1c8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
    if (local_1c8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_1c8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_1c8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_1c8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_1c8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_250.m_data[0] = local_1f8 + pCVar15->m_data[0];
    local_250.m_data[1] = local_1f8 + pCVar15->m_data[1];
    auVar14._8_8_ = uStack_1e0;
    auVar14._0_8_ = local_1e8;
    local_250.m_data[2] = local_1e8;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = pCVar15->m_data[2];
    auVar19 = vfmadd132sd_fma(auVar24,auVar14,ZEXT816(0x4000000000000000));
    local_238.m_data[0] = 0.0;
    local_238.m_data[1] = 0.0;
    local_238.m_data[2] = auVar19._0_8_;
    local_218.m_data[0] = 1.0;
    local_218.m_data[1] = 0.0;
    local_218.m_data[2] = 0.0;
    local_218.m_data[3] = 0.0;
    ChVisualMaterial::Default();
    AddBoxGeometry(pCVar4,&local_1c8,&local_250,&local_238,&local_218,true,&local_f0);
    _Var18._M_pi = local_1c8.
                   super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
    if (local_f0.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_f0.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var18._M_pi = local_1c8.
                     super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
    }
  }
  if (_Var18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var18._M_pi);
  }
LAB_0093ff41:
  plVar2 = *(long **)(*(long *)this + 0x198);
  p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*(long *)this + 0x1a0);
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  (**(code **)(*plVar2 + 0x20))();
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  local_1d8 = *(undefined8 *)this;
  local_1d0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
  if (local_1d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_1d0->_M_use_count = local_1d0->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_1d0->_M_use_count = local_1d0->_M_use_count + 1;
    }
  }
  (*(local_100->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x25])
            (local_100,&local_1d8);
  _Var18._M_pi = extraout_RDX;
  if (local_1d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d0);
    _Var18._M_pi = extraout_RDX_00;
  }
  sVar26.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var18._M_pi;
  sVar26.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chrono::ChBody>)
         sVar26.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ChBody> CreateBoxContainer(ChSystem* system,
                                           int id,
                                           std::shared_ptr<ChMaterialSurface> mat,
                                           const ChVector<>& hdim,
                                           double hthick,
                                           const ChVector<>& pos,
                                           const ChQuaternion<>& rot,
                                           bool collide,
                                           bool y_up,
                                           bool overlap,
                                           bool closed) {
    // Verify consistency of input arguments.
    assert(mat->GetContactMethod() == system->GetContactMethod());

    // Create the body and set material
    std::shared_ptr<ChBody> body(system->NewBody());

    // Set body properties and geometry.
    body->SetIdentifier(id);
    body->SetMass(1);
    body->SetPos(pos);
    body->SetRot(rot);
    body->SetCollide(collide);
    body->SetBodyFixed(true);
    double o_lap = 0;
    if (overlap) {
        o_lap = hthick * 2;
    }
    body->GetCollisionModel()->ClearModel();
    if (y_up) {
        AddBoxGeometry(body.get(), mat, ChVector<>(hdim.x() + o_lap, hthick, hdim.y() + o_lap),
                       ChVector<>(0, -hthick, 0));
        AddBoxGeometry(body.get(), mat, ChVector<>(hthick, hdim.z() + o_lap, hdim.y() + o_lap),
                       ChVector<>(-hdim.x() - hthick, hdim.z(), 0));
        AddBoxGeometry(body.get(), mat, ChVector<>(hthick, hdim.z() + o_lap, hdim.y() + o_lap),
                       ChVector<>(hdim.x() + hthick, hdim.z(), 0));
        AddBoxGeometry(body.get(), mat, ChVector<>(hdim.x() + o_lap, hdim.z() + o_lap, hthick),
                       ChVector<>(0, hdim.z(), -hdim.y() - hthick));
        AddBoxGeometry(body.get(), mat, ChVector<>(hdim.x() + o_lap, hdim.z() + o_lap, hthick),
                       ChVector<>(0, hdim.z(), hdim.y() + hthick));
        if (closed) {
            AddBoxGeometry(body.get(), mat, ChVector<>(hdim.x() + o_lap, hthick, hdim.y() + o_lap),
                           ChVector<>(0, hdim.z() * 2 + hthick, 0));
        }
    } else {
        AddBoxGeometry(body.get(), mat, ChVector<>(hdim.x() + o_lap, hdim.y() + o_lap, hthick),
                       ChVector<>(0, 0, -hthick));
        AddBoxGeometry(body.get(), mat, ChVector<>(hthick, hdim.y() + o_lap, hdim.z() + o_lap),
                       ChVector<>(-hdim.x() - hthick, 0, hdim.z()));
        AddBoxGeometry(body.get(), mat, ChVector<>(hthick, hdim.y() + o_lap, hdim.z() + o_lap),
                       ChVector<>(hdim.x() + hthick, 0, hdim.z()));
        AddBoxGeometry(body.get(), mat, ChVector<>(hdim.x() + o_lap, hthick, hdim.z() + o_lap),
                       ChVector<>(0, -hdim.y() - hthick, hdim.z()));
        AddBoxGeometry(body.get(), mat, ChVector<>(hdim.x() + o_lap, hthick, hdim.z() + o_lap),
                       ChVector<>(0, hdim.y() + hthick, hdim.z()));
        if (closed) {
            AddBoxGeometry(body.get(), mat, ChVector<>(hdim.x() + o_lap, hdim.y() + o_lap, hthick),
                           ChVector<>(0, 0, hdim.z() * 2 + hthick));
        }
    }
    body->GetCollisionModel()->BuildModel();

    // Attach the body to the system.
    system->AddBody(body);
    return body;
}